

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O0

void __thiscall
gss::innards::Proof::backtrack_from_binary_variables
          (Proof *this,vector<int,_std::allocator<int>_> *v)

{
  bool bVar1;
  pointer pIVar2;
  type pbVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  ostream *poVar7;
  vector<int,_std::allocator<int>_> *in_RSI;
  function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
  *in_RDI;
  function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
  f;
  int *w;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff38;
  function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
  *in_stack_ffffffffffffff40;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__args_1;
  uint __args;
  function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
  *this_00;
  anon_class_24_3_5ea14507 *in_stack_ffffffffffffff58;
  undefined1 local_98 [16];
  pointer in_stack_ffffffffffffff78;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff80;
  function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
  local_58;
  long local_38;
  int *local_30;
  int *local_28;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_20;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  pIVar2 = std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
           ::operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1a6449);
  if ((pIVar2->doing_hom_colour_proof & 1U) == 0) {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x1a6460);
    pbVar3 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff40);
    std::operator<<(pbVar3,"u");
    local_18 = local_10;
    local_20._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff38);
    local_28 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff38);
    while( true ) {
      bVar1 = __gnu_cxx::operator==<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                        ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff40,
                         (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff38);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      local_30 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                 ::operator*(&local_20);
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1a64f7);
      pbVar3 = std::
               unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
               ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                            *)in_stack_ffffffffffffff40);
      poVar4 = std::operator<<(pbVar3," 1 ~x");
      std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
      operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                  *)0x1a6524);
      local_38 = (long)*local_30;
      pmVar5 = std::
               map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](in_stack_ffffffffffffff80,
                            (key_type_conflict1 *)in_stack_ffffffffffffff78);
      std::operator<<(poVar4,(string *)pmVar5);
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_20);
    }
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x1a6577);
    pbVar3 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff40);
    std::operator<<(pbVar3," >= 1 ;\n");
    pIVar2 = std::
             unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
             operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                         *)0x1a659f);
    pIVar2->proof_line = pIVar2->proof_line + 1;
  }
  else {
    std::unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>::
    operator->((unique_ptr<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                *)0x1a65c0);
    pbVar3 = std::
             unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
             ::operator*((unique_ptr<std::basic_ostream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ostream<char,_std::char_traits<char>_>_>_>
                          *)in_stack_ffffffffffffff40);
    poVar4 = std::operator<<(pbVar3,"* backtrack shenanigans, depth ");
    sVar6 = std::vector<int,_std::allocator<int>_>::size(local_10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar4,sVar6);
    __args = (uint)((ulong)poVar4 >> 0x20);
    std::operator<<(poVar7,'\n');
    this_00 = &local_58;
    std::
    function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
    ::function(in_stack_ffffffffffffff40);
    std::
    function<void(unsigned_int,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>const&)>
    ::operator=(in_RDI,in_stack_ffffffffffffff58);
    local_98 = (undefined1  [16])0x0;
    __args_1 = (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)local_98;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x1a6668);
    std::
    function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
    ::operator()(this_00,__args,__args_1);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
    std::
    function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
    ::~function((function<void_(unsigned_int,_const_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_&)>
                 *)0x1a668f);
  }
  return;
}

Assistant:

auto Proof::backtrack_from_binary_variables(const vector<int> & v) -> void
{
    if (! _imp->doing_hom_colour_proof) {
        *_imp->proof_stream << "u";
        for (auto & w : v)
            *_imp->proof_stream << " 1 ~x" << _imp->binary_variable_mappings[w];
        *_imp->proof_stream << " >= 1 ;\n";
        ++_imp->proof_line;
    }
    else {
        *_imp->proof_stream << "* backtrack shenanigans, depth " << v.size() << '\n';
        function<auto(unsigned, const vector<pair<int, int>> &)->void> f;
        f = [&](unsigned d, const vector<pair<int, int>> & trail) -> void {
            if (d == v.size()) {
                *_imp->proof_stream << "u 1 ~x" << _imp->variable_mappings[pair{_imp->hom_colour_proof_p.first, _imp->hom_colour_proof_t.first}];
                for (auto & t : trail)
                    *_imp->proof_stream << " 1 ~x" << _imp->variable_mappings[t];
                *_imp->proof_stream << " >= 1 ;\n";
                ++_imp->proof_line;
            }
            else {
                for (auto & p : _imp->p_clique) {
                    vector<pair<int, int>> new_trail{trail};
                    new_trail.emplace_back(pair{p.first, _imp->t_clique_neighbourhood.find(v[d])->second.first});
                    f(d + 1, new_trail);
                }
            }
        };
        f(0, {});
    }
}